

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

Table * luaH_new(lua_State *L)

{
  Table *pTVar1;
  
  pTVar1 = (Table *)luaC_newobj(L,5,0x38);
  pTVar1->flags = '?';
  pTVar1->lsizenode = '\0';
  pTVar1->array = (TValue *)0x0;
  pTVar1->alimit = 0;
  pTVar1->node = &dummynode_;
  pTVar1->lastfree = (Node *)0x0;
  pTVar1->metatable = (Table *)0x0;
  return pTVar1;
}

Assistant:

Table *luaH_new (lua_State *L) {
  GCObject *o = luaC_newobj(L, LUA_VTABLE, sizeof(Table));
  Table *t = gco2t(o);
  t->metatable = NULL;
  t->flags = cast_byte(maskflags);  /* table has no metamethod fields */
  t->array = NULL;
  t->alimit = 0;
  setnodevector(L, t, 0);
  return t;
}